

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeCurve::~IfcCompositeCurve(IfcCompositeCurve *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar1;
  
  *(undefined ***)&this[-1].super_IfcBoundedCurve.field_0x50 = &PTR__IfcCompositeCurve_008115d8;
  *(undefined ***)&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x38 =
       &PTR__IfcCompositeCurve_008116a0;
  *(undefined ***)&this[-1].field_0x60 = &PTR__IfcCompositeCurve_00811600;
  this[-1].SelfIntersect.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__IfcCompositeCurve_00811628;
  *(undefined ***)&this[-1].field_0x80 = &PTR__IfcCompositeCurve_00811650;
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCompositeCurve_00811678;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
              field_0x30;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pvVar1 = *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.
                      super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  operator_delete(&this[-1].super_IfcBoundedCurve.field_0x50);
  return;
}

Assistant:

IfcCompositeCurve() : Object("IfcCompositeCurve") {}